

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O0

void __thiscall t_lua_generator::generate_service(t_lua_generator *this,t_service *tservice)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  ostream *poVar3;
  t_service *ptVar4;
  t_lua_generator *this_00;
  undefined4 extraout_var_00;
  int __oflag;
  t_program *program;
  t_program *program_00;
  ofstream_with_content_based_conditional_update *out;
  string local_150;
  string local_130;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string f_service_name;
  undefined1 local_58 [8];
  string cur_ns;
  string outdir;
  t_service *tservice_local;
  t_lua_generator *this_local;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])
            ((undefined1 *)((long)&cur_ns.field_2 + 8));
  get_namespace_abi_cxx11_
            ((string *)local_58,
             (t_lua_generator *)(this->super_t_oop_generator).super_t_generator.program_,program);
  std::operator+(&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&cur_ns.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  iVar1 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::operator+(&local_a8,&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar1));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 &local_a8,".lua");
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,pcVar2,&local_e9);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_service_,(char *)local_e8,__oflag);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_110);
  poVar3 = std::operator<<((ostream *)&this->f_service_,local_110);
  lua_includes_abi_cxx11_(&local_130,this);
  std::operator<<(poVar3,(string *)&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string(local_110);
  if ((this->gen_requires_ & 1U) != 0) {
    poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"require \'");
    poVar3 = std::operator<<(poVar3,(string *)local_58);
    poVar3 = std::operator<<(poVar3,"ttypes\'");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    ptVar4 = t_service::get_extends(tservice);
    if (ptVar4 != (t_service *)0x0) {
      poVar3 = std::operator<<((ostream *)&this->f_service_,"require \'");
      ptVar4 = t_service::get_extends(tservice);
      this_00 = (t_lua_generator *)t_type::get_program(&ptVar4->super_t_type);
      get_namespace_abi_cxx11_(&local_150,this_00,program_00);
      poVar3 = std::operator<<(poVar3,(string *)&local_150);
      ptVar4 = t_service::get_extends(tservice);
      iVar1 = (*(ptVar4->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_00,iVar1));
      poVar3 = std::operator<<(poVar3,"\'");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_150);
    }
  }
  std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
  generate_service_client(this,(ostream *)&this->f_service_,tservice);
  generate_service_interface(this,(ostream *)&this->f_service_,tservice);
  generate_service_processor(this,(ostream *)&this->f_service_,tservice);
  out = &this->f_service_;
  generate_service_helpers(this,(ostream *)out,tservice);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&this->f_service_,(int)out);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(cur_ns.field_2._M_local_buf + 8));
  return;
}

Assistant:

void t_lua_generator::generate_service(t_service* tservice) {
  // Get output directory
  string outdir = get_out_dir();

  // Open the file for writing
  string cur_ns = get_namespace(program_);
  string f_service_name = outdir + cur_ns + tservice->get_name() + ".lua";
  f_service_.open(f_service_name.c_str());

  // Headers
  f_service_ << autogen_comment() << lua_includes();
  if (gen_requires_) {
    f_service_ << endl << "require '" << cur_ns << "ttypes'" << endl;

    if (tservice->get_extends() != nullptr) {
      f_service_ << "require '" << get_namespace(tservice->get_extends()->get_program())
                 << tservice->get_extends()->get_name() << "'" << endl;
    }
  }

  f_service_ << endl;

  generate_service_client(f_service_, tservice);
  generate_service_interface(f_service_, tservice);
  generate_service_processor(f_service_, tservice);
  generate_service_helpers(f_service_, tservice);

  // Close the file
  f_service_.close();
}